

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexHelper.cpp
# Opt level: O1

Var Js::RegexHelper::NonMatchValue(ScriptContext *scriptContext,bool isGlobalCtor)

{
  JavascriptLibrary *this;
  JavascriptString *pJVar1;
  undefined3 in_register_00000031;
  
  this = (scriptContext->super_ScriptContextBase).javascriptLibrary;
  if (CONCAT31(in_register_00000031,isGlobalCtor) != 0) {
    pJVar1 = JavascriptLibrary::GetEmptyString(this);
    return pJVar1;
  }
  return (this->super_JavascriptLibraryBase).undefinedValue.ptr;
}

Assistant:

Var RegexHelper::NonMatchValue(ScriptContext* scriptContext, bool isGlobalCtor)
    {
        // SPEC DEVIATION: The $n properties of the RegExp ctor use empty strings rather than undefined to represent
        //                 the non-match value, even in ES5 mode.
        if (isGlobalCtor)
            return scriptContext->GetLibrary()->GetEmptyString();
        else
            return scriptContext->GetLibrary()->GetUndefined();
    }